

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encode<capnproto_test::capnp::test::TestOldVersion::Builder&>
          (String *__return_storage_ptr__,JsonCodec *this,Builder *value)

{
  Builder *this_00;
  Reader local_a8;
  Reader local_78;
  undefined1 auStack_30 [8];
  Type type;
  Builder *value_local;
  JsonCodec *this_local;
  
  type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)value;
  _auStack_30 = capnp::Type::from<capnproto_test::capnp::test::TestOldVersion::Builder&>(value);
  this_00 = kj::fwd<capnproto_test::capnp::test::TestOldVersion::Builder&>
                      ((Builder *)type.field_4.schema);
  capnproto_test::capnp::test::TestOldVersion::Builder::operator_cast_to_Reader(&local_a8,this_00);
  DynamicValue::Reader::
  Reader<capnproto_test::capnp::test::TestOldVersion::Reader,capnp::DynamicStruct::Reader>
            (&local_78,&local_a8);
  encode(__return_storage_ptr__,this,&local_78,_auStack_30);
  DynamicValue::Reader::~Reader(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}